

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall
CRenderTools::SelectSprite(CRenderTools *this,CDataSprite *pSpr,int Flags,int sx,int sy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  IGraphics *pIVar7;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  CRenderTools *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  float fVar8;
  float f;
  int cy;
  int cx;
  int h;
  int w;
  int y;
  int x;
  float y2;
  float y1;
  float x2;
  float x1;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = *(int *)(in_RSI + 0x10) + in_ECX;
  iVar6 = *(int *)(in_RSI + 0x14) + in_R8D;
  iVar1 = *(int *)(in_RSI + 0x18);
  iVar2 = *(int *)(in_RSI + 0x1c);
  iVar3 = *(int *)(*(long *)(in_RSI + 8) + 8);
  iVar4 = *(int *)(*(long *)(in_RSI + 8) + 0xc);
  fVar8 = sqrtf((float)(iVar2 * iVar2 + iVar1 * iVar1));
  gs_SpriteWScale = (float)iVar1 / fVar8;
  gs_SpriteHScale = (float)iVar2 / fVar8;
  local_c = (float)iVar5 / (float)iVar3 + 0.5 / (float)(iVar3 << 5);
  local_10 = (float)(iVar5 + iVar1) / (float)iVar3 - 0.5 / (float)(iVar3 << 5);
  local_14 = (float)iVar6 / (float)iVar4 + 0.5 / (float)(iVar4 << 5);
  local_18 = (float)(iVar6 + iVar2) / (float)iVar4 - 0.5 / (float)(iVar4 << 5);
  if ((in_EDX & 1) != 0) {
    std::swap<float>(&local_14,&local_18);
  }
  if ((in_EDX & 2) != 0) {
    std::swap<float>(&local_c,&local_10);
  }
  pIVar7 = Graphics(in_RDI);
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])
            (local_c,local_14,local_10,local_18,pIVar7,0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::SelectSprite(const CDataSprite *pSpr, int Flags, int sx, int sy)
{
	int x = pSpr->m_X+sx;
	int y = pSpr->m_Y+sy;
	int w = pSpr->m_W;
	int h = pSpr->m_H;
	int cx = pSpr->m_pSet->m_Gridx;
	int cy = pSpr->m_pSet->m_Gridy;

	float f = sqrtf(h*h + w*w);
	gs_SpriteWScale = w/f;
	gs_SpriteHScale = h/f;

	float x1 = x/(float)cx + 0.5f/(float)(cx*32);
	float x2 = (x+w)/(float)cx - 0.5f/(float)(cx*32);
	float y1 = y/(float)cy + 0.5f/(float)(cy*32);
	float y2 = (y+h)/(float)cy - 0.5f/(float)(cy*32);

	if(Flags&SPRITE_FLAG_FLIP_Y)
		std::swap(y1, y2);

	if(Flags&SPRITE_FLAG_FLIP_X)
		std::swap(x1, x2);

	Graphics()->QuadsSetSubset(x1, y1, x2, y2);
}